

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int hkdf_expand_label(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
                     char *label,ptls_iovec_t hash_value,char *label_prefix)

{
  ptls_iovec_t info;
  ptls_iovec_t prk;
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *puVar4;
  size_t sVar5;
  char cVar6;
  size_t sVar7;
  uint8_t hkdf_label_buf [512];
  ptls_buffer_t local_288;
  ptls_hash_algorithm_t *local_268;
  void *local_260;
  uint8_t *local_258;
  size_t local_250;
  uint8_t *local_248;
  size_t sStack_240;
  uint8_t local_238 [520];
  
  local_250 = secret.len;
  local_258 = secret.base;
  local_268 = algo;
  local_260 = output;
  if (label_prefix == (char *)0x0) {
    __assert_fail("label_prefix != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                  ,0x135e,
                  "int hkdf_expand_label(ptls_hash_algorithm_t *, void *, size_t, ptls_iovec_t, const char *, ptls_iovec_t, const char *)"
                 );
  }
  local_288.base = local_238;
  local_288.off = 0;
  local_288.capacity = 0x200;
  local_288.is_allocated = 0;
  iVar2 = ptls_buffer_reserve(&local_288,2);
  puVar4 = local_288.base;
  sVar7 = local_288.off;
  if (iVar2 == 0) {
    *(ushort *)(local_288.base + local_288.off) = (ushort)outlen << 8 | (ushort)outlen >> 8;
    local_288.off = local_288.off + 2;
    iVar2 = ptls_buffer_reserve(&local_288,1);
    sVar1 = local_288.off;
    puVar4 = local_288.base;
    sVar7 = local_288.off;
    if (iVar2 == 0) {
      local_288.base[local_288.off] = '\0';
      sVar5 = local_288.off + 1;
      local_288.off = sVar5;
      sVar3 = strlen(label_prefix);
      sVar7 = sVar5;
      if (sVar3 != 0) {
        iVar2 = ptls_buffer_reserve(&local_288,sVar3);
        sVar7 = local_288.off;
        puVar4 = local_288.base;
        if (iVar2 != 0) goto LAB_0010b8ee;
        memcpy(local_288.base + local_288.off,label_prefix,sVar3);
        sVar7 = sVar3 + sVar7;
        local_288.off = sVar7;
      }
      cVar6 = (char)sVar7;
      sVar3 = strlen(label);
      if (sVar3 != 0) {
        iVar2 = ptls_buffer_reserve(&local_288,sVar3);
        sVar7 = local_288.off;
        puVar4 = local_288.base;
        if (iVar2 != 0) goto LAB_0010b8ee;
        memcpy(local_288.base + local_288.off,label,sVar3);
        local_288.off = sVar3 + sVar7;
        cVar6 = (char)local_288.off;
      }
      puVar4[sVar1] = cVar6 - (char)sVar5;
      iVar2 = ptls_buffer_reserve(&local_288,1);
      sVar1 = local_288.off;
      puVar4 = local_288.base;
      sVar7 = local_288.off;
      if (iVar2 == 0) {
        local_288.base[local_288.off] = '\0';
        sVar5 = local_288.off + 1;
        sVar7 = sVar5;
        if (hash_value.len != 0) {
          local_288.off = sVar5;
          iVar2 = ptls_buffer_reserve(&local_288,hash_value.len);
          sVar7 = local_288.off;
          puVar4 = local_288.base;
          if (iVar2 != 0) goto LAB_0010b8ee;
          memcpy(local_288.base + local_288.off,hash_value.base,hash_value.len);
          sVar7 = sVar7 + hash_value.len;
        }
        puVar4[sVar1] = (char)sVar7 - (char)sVar5;
        prk.len = local_250;
        prk.base = local_258;
        info.len = sVar7;
        info.base = puVar4;
        local_288.off = sVar7;
        local_248 = puVar4;
        sStack_240 = sVar7;
        iVar2 = ptls_hkdf_expand(local_268,local_260,outlen,prk,info);
      }
    }
  }
LAB_0010b8ee:
  (*ptls_clear_memory)(puVar4,sVar7);
  if (local_288.is_allocated != 0) {
    free(puVar4);
  }
  return iVar2;
}

Assistant:

int hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                      ptls_iovec_t hash_value, const char *label_prefix)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[512];
    int ret;

    assert(label_prefix != NULL);

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, (uint16_t)outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        ptls_buffer_pushv(&hkdf_label, label_prefix, strlen(label_prefix));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}